

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

Error __thiscall miniros::MasterLink::initLink(MasterLink *this,M_string *remappings)

{
  Internal *pIVar1;
  bool bVar2;
  const_iterator cVar3;
  char *pcVar4;
  Error_t EVar5;
  allocator<char> local_41;
  key_type local_40;
  
  if (this->internal_ == (Internal *)0x0) {
    EVar5 = InternalError;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"__master",&local_41);
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&remappings->_M_t,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if ((_Rb_tree_header *)cVar3._M_node != &(remappings->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_assign((string *)&this->internal_->uri);
    }
    pIVar1 = this->internal_;
    if ((pIVar1->uri)._M_string_length == 0) {
      pcVar4 = getenv("ROS_MASTER_URI");
      if (pcVar4 == (char *)0x0) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (initLink::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,"miniros.master_link",&local_41);
          console::initializeLogLocation(&initLink::loc,&local_40,Warn);
          std::__cxx11::string::~string((string *)&local_40);
        }
        if (initLink::loc.level_ != Warn) {
          console::setLogLocationLevel(&initLink::loc,Warn);
          console::checkLogLocationEnabled(&initLink::loc);
        }
        if (initLink::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,initLink::loc.logger_,initLink::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                         ,0x60,"Error miniros::MasterLink::initLink(const M_string &)",
                         "Defaulting ROS_MASTER_URI to localhost:11311");
        }
        pIVar1 = this->internal_;
      }
      std::__cxx11::string::assign((char *)&pIVar1->uri);
    }
    pIVar1 = this->internal_;
    bVar2 = network::splitURI(&pIVar1->uri,&pIVar1->host,&pIVar1->port);
    EVar5 = Ok;
    if (!bVar2) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
          ::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"miniros.master_link",&local_41);
        console::initializeLogLocation
                  (&initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                    ::loc,&local_40,Fatal);
        std::__cxx11::string::~string((string *)&local_40);
      }
      if (initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
          ::loc.level_ != Fatal) {
        console::setLogLocationLevel
                  (&initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                    ::loc,Fatal);
        console::checkLogLocationEnabled
                  (&initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                    ::loc);
      }
      EVar5 = InvalidURI;
      if (initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
          ::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,
                       initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                       ::loc.logger_,
                       initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                       ::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                       ,0x6b,"Error miniros::MasterLink::initLink(const M_string &)",
                       "Couldn\'t parse the master URI [%s] into a host:port pair.",
                       (this->internal_->uri)._M_dataplus._M_p);
      }
    }
  }
  return (Error)EVar5;
}

Assistant:

Error MasterLink::initLink(const M_string& remappings)
{
  if (!internal_)
    return Error::InternalError;

  auto it = remappings.find("__master");
  if (it != remappings.end()) {
    internal_->uri = it->second;
  }

  if (internal_->uri.empty()) {
    char* master_uri_env = NULL;
#ifdef _MSC_VER
    _dupenv_s(&master_uri_env, NULL, "ROS_MASTER_URI");
#else
    master_uri_env = getenv("ROS_MASTER_URI");
#endif
    if (master_uri_env) {
      internal_->uri = master_uri_env;
    } else {
      MINIROS_WARN("Defaulting ROS_MASTER_URI to localhost:11311");
      internal_->uri = "http://localhost:11311";
    }
#ifdef _MSC_VER
    // http://msdn.microsoft.com/en-us/library/ms175774(v=vs.80).aspx
    free(master_uri_env);
#endif
  }

  // Split URI into
  if (!network::splitURI(internal_->uri, internal_->host, internal_->port)) {
    MINIROS_FATAL("Couldn't parse the master URI [%s] into a host:port pair.", internal_->uri.c_str());
    return Error::InvalidURI;
  }

  return Error::Ok;
}